

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ifc.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Iifc::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Iifc *this)

{
  uint32_t cls;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  SingleMthdTest *pSVar1;
  result_type rVar2;
  MthdNotify *this_00;
  MthdPatch *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdDmaGrobj *this_04;
  MthdCtxChroma *this_05;
  MthdCtxClip *this_06;
  MthdCtxPattern *this_07;
  MthdCtxRop *this_08;
  MthdCtxBeta *this_09;
  MthdCtxBeta4 *this_10;
  MthdCtxSurf2D *this_11;
  MthdMissing *this_12;
  MthdOperation *this_13;
  MthdIfcFormat *this_14;
  MthdIndexFormat *this_15;
  MthdPaletteOffset *this_16;
  MthdVtxXy *this_17;
  MthdIfcSize *pMVar3;
  MthdIifcData *this_18;
  allocator local_4a9;
  string local_4a8 [32];
  SingleMthdTest *local_488;
  iterator local_480;
  undefined8 local_478;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_470;
  const_iterator local_468;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_45b;
  undefined1 local_45a;
  allocator local_459;
  string local_458 [38];
  undefined1 local_432;
  allocator local_431;
  string local_430 [38];
  undefined1 local_40a;
  allocator local_409;
  string local_408 [38];
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [38];
  undefined1 local_27a;
  allocator local_279;
  string local_278 [38];
  undefined1 local_252;
  allocator local_251;
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [38];
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  undefined1 local_18a;
  allocator local_189;
  string local_188 [38];
  undefined1 local_162;
  allocator local_161;
  string local_160 [38];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [38];
  undefined1 local_112;
  allocator local_111;
  string local_110 [48];
  SingleMthdTest *local_e0;
  MthdNotify *local_d8;
  MthdPatch *local_d0;
  MthdPmTrigger *local_c8;
  MthdDmaNotify *local_c0;
  MthdDmaGrobj *local_b8;
  MthdCtxChroma *local_b0;
  MthdCtxClip *local_a8;
  MthdCtxPattern *local_a0;
  MthdCtxRop *local_98;
  MthdCtxBeta *local_90;
  MthdCtxBeta4 *local_88;
  MthdCtxSurf2D *local_80;
  MthdMissing *local_78;
  MthdOperation *local_70;
  MthdIfcFormat *local_68;
  MthdIndexFormat *local_60;
  MthdPaletteOffset *local_58;
  MthdVtxXy *local_50;
  MthdIfcSize *local_48;
  MthdIfcSize *local_40;
  MthdIifcData *local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Iifc *local_18;
  Iifc *this_local;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Iifc *)__return_storage_ptr__;
  pSVar1 = (SingleMthdTest *)operator_new(0x25950);
  local_112 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"nop",&local_111);
  MthdNop::SingleMthdTest
            ((MthdNop *)pSVar1,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_110,-1,
             (this->super_Class).cls,0x100,1,4);
  local_112 = 0;
  local_e0 = pSVar1;
  this_00 = (MthdNotify *)operator_new(0x25950);
  local_13a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"notify",&local_139);
  MthdNotify::SingleMthdTest
            (this_00,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_138,0,
             (this->super_Class).cls,0x104,1,4);
  local_13a = 0;
  local_d8 = this_00;
  this_01 = (MthdPatch *)operator_new(0x25950);
  local_162 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"patch",&local_161);
  MthdPatch::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_160,-1,
             (this->super_Class).cls,0x10c,1,4);
  local_162 = 0;
  local_d0 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_18a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"pm_trigger",&local_189);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_188,-1,
             (this->super_Class).cls,0x140,1,4);
  local_18a = 0;
  local_c8 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_1b2 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"dma_notify",&local_1b1);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_1b0,1,
             (this->super_Class).cls,0x180,1,4);
  local_1b2 = 0;
  local_c0 = this_03;
  this_04 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1da = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"dma_palette",&local_1d9);
  MthdDmaGrobj::MthdDmaGrobj
            (this_04,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_1d8,2,
             (this->super_Class).cls,0x184,0,0);
  local_1da = 0;
  local_b8 = this_04;
  this_05 = (MthdCtxChroma *)operator_new(0x25958);
  local_202 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"ctx_chroma",&local_201);
  MthdCtxChroma::MthdCtxChroma
            (this_05,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_200,3,
             (this->super_Class).cls,0x188,true);
  local_202 = 0;
  local_b0 = this_05;
  this_06 = (MthdCtxClip *)operator_new(0x25950);
  local_22a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"ctx_clip",&local_229);
  MthdCtxClip::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_228,4,
             (this->super_Class).cls,0x18c,1,4);
  local_22a = 0;
  local_a8 = this_06;
  this_07 = (MthdCtxPattern *)operator_new(0x25958);
  local_252 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"ctx_pattern",&local_251);
  MthdCtxPattern::MthdCtxPattern
            (this_07,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_250,5,
             (this->super_Class).cls,400,true);
  local_252 = 0;
  local_a0 = this_07;
  this_08 = (MthdCtxRop *)operator_new(0x25950);
  local_27a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"ctx_rop",&local_279);
  MthdCtxRop::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_278,6,
             (this->super_Class).cls,0x194,1,4);
  local_27a = 0;
  local_98 = this_08;
  this_09 = (MthdCtxBeta *)operator_new(0x25950);
  local_2a2 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"ctx_beta",&local_2a1);
  MthdCtxBeta::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_2a0,7,
             (this->super_Class).cls,0x198,1,4);
  local_2a2 = 0;
  local_90 = this_09;
  this_10 = (MthdCtxBeta4 *)operator_new(0x25950);
  local_2ca = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"ctx_beta4",&local_2c9);
  MthdCtxBeta4::SingleMthdTest
            (this_10,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_2c8,8,
             (this->super_Class).cls,0x19c,1,4);
  local_2ca = 0;
  local_88 = this_10;
  this_11 = (MthdCtxSurf2D *)operator_new(0x25958);
  local_2f2 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"ctx_surf2d",&local_2f1);
  cls = (this->super_Class).cls;
  MthdCtxSurf2D::MthdCtxSurf2D
            (this_11,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_2f0,9,cls,0x1a0,
             cls == 0x60 ^ 3);
  local_2f2 = 0;
  local_80 = this_11;
  this_12 = (MthdMissing *)operator_new(0x25950);
  local_31a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"missing",&local_319);
  MthdMissing::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_318,-1,
             (this->super_Class).cls,0x200,1,4);
  local_31a = 0;
  local_78 = this_12;
  this_13 = (MthdOperation *)operator_new(0x25958);
  local_342 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"operation",&local_341);
  MthdOperation::MthdOperation
            (this_13,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_340,10,
             (this->super_Class).cls,0x3e4,true);
  local_342 = 0;
  local_70 = this_13;
  this_14 = (MthdIfcFormat *)operator_new(0x25958);
  local_36a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"format",&local_369);
  MthdIfcFormat::MthdIfcFormat
            (this_14,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_368,0xb,
             (this->super_Class).cls,1000,true);
  local_36a = 0;
  local_68 = this_14;
  this_15 = (MthdIndexFormat *)operator_new(0x25950);
  local_392 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"index_format",&local_391);
  MthdIndexFormat::SingleMthdTest
            (this_15,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_390,0xc,
             (this->super_Class).cls,0x3ec,1,4);
  local_392 = 0;
  local_60 = this_15;
  this_16 = (MthdPaletteOffset *)operator_new(0x25950);
  local_3ba = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"palette_offset",&local_3b9);
  MthdPaletteOffset::SingleMthdTest
            (this_16,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_3b8,0xd,
             (this->super_Class).cls,0x3f0,1,4);
  local_3ba = 0;
  local_58 = this_16;
  this_17 = (MthdVtxXy *)operator_new(0x25958);
  local_3e2 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"xy",&local_3e1);
  MthdVtxXy::MthdVtxXy
            (this_17,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_3e0,0xe,
             (this->super_Class).cls,0x3f4,1,4,0x21);
  local_3e2 = 0;
  local_50 = this_17;
  pMVar3 = (MthdIfcSize *)operator_new(0x25958);
  local_40a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"size_out",&local_409);
  MthdIfcSize::MthdIfcSize
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_408,0xf,
             (this->super_Class).cls,0x3f8,4);
  local_40a = 0;
  local_48 = pMVar3;
  pMVar3 = (MthdIfcSize *)operator_new(0x25958);
  local_432 = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"size_in",&local_431);
  MthdIfcSize::MthdIfcSize
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_430,0x10,
             (this->super_Class).cls,0x3fc,2);
  local_432 = 0;
  local_40 = pMVar3;
  this_18 = (MthdIifcData *)operator_new(0x25950);
  local_45a = 1;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"iifc_data",&local_459);
  MthdIifcData::SingleMthdTest
            (this_18,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_458,0x11,
             (this->super_Class).cls,0x400,0x700,4);
  local_45a = 0;
  local_30 = &local_e0;
  local_28 = 0x16;
  local_38 = this_18;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_45b);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l_00,&local_45b);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_45b);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  if (((this->super_Class).cls & 0xff) == 100) {
    local_470._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_468,&local_470);
    pSVar1 = (SingleMthdTest *)operator_new(0x25950);
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8,"dither",&local_4a9);
    MthdDither::SingleMthdTest
              ((MthdDither *)pSVar1,&(this->super_Class).opt,(uint32_t)rVar2,(string *)local_4a8,
               0x12,(this->super_Class).cls,0x3e0,1,4);
    local_480 = &local_488;
    local_478 = 1;
    __l._M_len = 1;
    __l._M_array = local_480;
    local_488 = pSVar1;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_468,__l);
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Iifc::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_palette", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxChroma(opt, rnd(), "ctx_chroma", 3, cls, 0x188, true),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 4, cls, 0x18c),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 5, cls, 0x190, true),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 6, cls, 0x194),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 7, cls, 0x198),
		new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 8, cls, 0x19c),
		new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 9, cls, 0x1a0, (cls == 0x60 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 10, cls, 0x3e4, true),
		new MthdIfcFormat(opt, rnd(), "format", 11, cls, 0x3e8, true),
		new MthdIndexFormat(opt, rnd(), "index_format", 12, cls, 0x3ec),
		new MthdPaletteOffset(opt, rnd(), "palette_offset", 13, cls, 0x3f0),
		new MthdVtxXy(opt, rnd(), "xy", 14, cls, 0x3f4, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdIfcSize(opt, rnd(), "size_out", 15, cls, 0x3f8, IFC_OUT),
		new MthdIfcSize(opt, rnd(), "size_in", 16, cls, 0x3fc, IFC_IN),
		new MthdIifcData(opt, rnd(), "iifc_data", 17, cls, 0x400, 0x700),
	};
	if ((cls & 0xff) == 0x64) {
		res.insert(res.end(), {
			new MthdDither(opt, rnd(), "dither", 18, cls, 0x3e0),
		});
	}
	return res;
}